

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::
     LPFwriteGenerals<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *p_lp,ostream *p_output,NameSet *p_cnames,DIdxSet *p_intvars)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  IdxSet *in_RCX;
  ostream *in_RSI;
  int j;
  char name [16];
  int i;
  NameSet *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffd8;
  
  if ((in_RCX != (IdxSet *)0x0) && (iVar1 = IdxSet::size(in_RCX), 0 < iVar1)) {
    std::operator<<(in_RSI,"Generals\n");
    iVar1 = 0;
    while (i = iVar1,
          iVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x16f68f), iVar1 < iVar2) {
      iVar2 = IdxSet::pos((IdxSet *)in_stack_ffffffffffffffc8,i);
      if (-1 < iVar2) {
        poVar3 = std::operator<<(in_RSI,"  ");
        pcVar4 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                            in_stack_ffffffffffffffc8,(char *)CONCAT44(i,iVar1));
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::operator<<(poVar3,"\n");
      }
      iVar1 = i + 1;
    }
  }
  return;
}

Assistant:

static void LPFwriteGenerals(
   const SPxLPBase<R>&   p_lp,         ///< the LP to write
   std::ostream&            p_output,     ///< output stream
   const NameSet*           p_cnames,     ///< column names
   const DIdxSet*           p_intvars     ///< integer variables
)
{
   char name[16];

   if(p_intvars == nullptr || p_intvars->size() <= 0)
      return;  // no integer variables

   p_output << "Generals\n";

   for(int j = 0; j < p_lp.nCols(); ++j)
      if(p_intvars->pos(j) >= 0)
         p_output << "  " << getColName(p_lp, j, p_cnames, name) << "\n";
}